

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

int __thiscall
djb::fresnel::sgd::clone(sgd *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_t sVar1;
  float *pfVar2;
  undefined8 *puVar3;
  void *pvVar4;
  ulong uVar5;
  
  puVar3 = (undefined8 *)operator_new(0x28);
  *puVar3 = &PTR_clone_001ffcb8;
  sVar1 = (this->f0)._M_size;
  puVar3[1] = sVar1;
  uVar5 = sVar1 << 2;
  pvVar4 = operator_new(uVar5);
  puVar3[2] = pvVar4;
  pfVar2 = (this->f0)._M_data;
  if (pfVar2 != (float *)0x0) {
    memcpy(pvVar4,pfVar2,uVar5);
  }
  sVar1 = (this->f1)._M_size;
  puVar3[3] = sVar1;
  uVar5 = sVar1 << 2;
  pvVar4 = operator_new(uVar5);
  puVar3[4] = pvVar4;
  pfVar2 = (this->f1)._M_data;
  if (pfVar2 != (float *)0x0) {
    memcpy(pvVar4,pfVar2,uVar5);
  }
  return (int)puVar3;
}

Assistant:

impl *clone() const {return new sgd(*this);}